

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

string * __thiscall
units::generateRawUnitString_abi_cxx11_
          (string *__return_storage_ptr__,units *this,precise_unit *un,uint64_t flags)

{
  int iVar1;
  int power;
  int power_00;
  int power_01;
  int power_02;
  int power_03;
  uint uVar2;
  int power_04;
  char *unit;
  int power_05;
  int power_06;
  int power_07;
  int power_08;
  uint64_t flags_00;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar1 = *(int *)(this + 8);
  power_06 = (iVar1 << 0x1c) >> 0x1c;
  if (0 < power_06) {
    addUnitPower(__return_storage_ptr__,"m",power_06,flags);
  }
  power_08 = (iVar1 << 0x15) >> 0x1d;
  if (0 < power_08) {
    addUnitPower(__return_storage_ptr__,"kg",power_08,flags);
  }
  power = (int)(char)iVar1 >> 4;
  if (0 < power) {
    addUnitPower(__return_storage_ptr__,"s",power,flags);
  }
  power_07 = (iVar1 << 0x12) >> 0x1d;
  if (0 < power_07) {
    addUnitPower(__return_storage_ptr__,"A",power_07,flags);
  }
  power_05 = (iVar1 << 0xd) >> 0x1d;
  if (0 < power_05) {
    addUnitPower(__return_storage_ptr__,"K",power_05,flags);
  }
  power_00 = (iVar1 << 0xb) >> 0x1e;
  if (0 < power_00) {
    addUnitPower(__return_storage_ptr__,"mol",power_00,flags);
  }
  power_01 = (int)(short)iVar1 >> 0xe;
  if (0 < power_01) {
    addUnitPower(__return_storage_ptr__,"cd",power_01,flags);
  }
  power_02 = (iVar1 << 4) >> 0x1e;
  if (0 < power_02) {
    addUnitPower(__return_storage_ptr__,"item",power_02,flags);
  }
  power_03 = (iVar1 << 6) >> 0x1e;
  if (0 < power_03) {
    addUnitPower(__return_storage_ptr__,"$",power_03,flags);
  }
  power_04 = (iVar1 << 8) >> 0x1d;
  if (0 < power_04) {
    addUnitPower(__return_storage_ptr__,"rad",power_04,flags);
  }
  addUnitFlagStrings((precise_unit *)this,__return_storage_ptr__);
  uVar2 = ((-((iVar1 << 6) >> 0x1f) - ((iVar1 << 4) >> 0x1f)) - ((iVar1 << 8) >> 0x1f)) +
          ((-((iVar1 << 0xb) >> 0x1f) - ((iVar1 << 0xd) >> 0x1f)) - ((int)(short)iVar1 >> 0x1f)) +
          (-((iVar1 << 0x12) >> 0x1f) - ((int)(char)iVar1 >> 0x1f)) +
          (-((iVar1 << 0x15) >> 0x1f) - ((iVar1 << 0x1c) >> 0x1f));
  flags_00 = (uint64_t)uVar2;
  if (uVar2 == 1) {
    if ((power == -1) && (__return_storage_ptr__->_M_string_length == 0)) {
      power_04 = 1;
      unit = "Hz";
      goto LAB_003bad1e;
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,'/');
    if (power_06 < 0) {
      addUnitPower(__return_storage_ptr__,"m",-power_06,flags_00);
    }
    if (power_08 < 0) {
      addUnitPower(__return_storage_ptr__,"kg",-power_08,flags_00);
    }
    if (power < 0) {
      addUnitPower(__return_storage_ptr__,"s",-power,flags_00);
    }
    if (power_07 < 0) {
      addUnitPower(__return_storage_ptr__,"A",-power_07,flags_00);
    }
    if (power_05 < 0) {
      addUnitPower(__return_storage_ptr__,"K",-power_05,flags_00);
    }
    if (power_00 < 0) {
      addUnitPower(__return_storage_ptr__,"mol",-power_00,flags_00);
    }
    if (power_01 < 0) {
      addUnitPower(__return_storage_ptr__,"cd",-power_01,flags_00);
    }
    if (power_02 < 0) {
      addUnitPower(__return_storage_ptr__,"item",-power_02,flags_00);
    }
    if (power_03 < 0) {
      addUnitPower(__return_storage_ptr__,"$",-power_03,flags_00);
    }
    if (-1 < power_04) {
      return __return_storage_ptr__;
    }
    power_04 = -power_04;
  }
  else {
    if ((int)uVar2 < 2) {
      return __return_storage_ptr__;
    }
    if (power_06 < 0) {
      addUnitPower(__return_storage_ptr__,"m",power_06,flags_00);
    }
    if (power_08 < 0) {
      addUnitPower(__return_storage_ptr__,"kg",power_08,flags_00);
    }
    if (power < 0) {
      addUnitPower(__return_storage_ptr__,"s",power,flags_00);
    }
    if (power_07 < 0) {
      addUnitPower(__return_storage_ptr__,"A",power_07,flags_00);
    }
    if (power_05 < 0) {
      addUnitPower(__return_storage_ptr__,"K",power_05,flags_00);
    }
    if (power_00 < 0) {
      addUnitPower(__return_storage_ptr__,"mol",power_00,flags_00);
    }
    if (power_01 < 0) {
      addUnitPower(__return_storage_ptr__,"cd",power_01,flags_00);
    }
    if (power_02 < 0) {
      addUnitPower(__return_storage_ptr__,"item",power_02,flags_00);
    }
    if (power_03 < 0) {
      addUnitPower(__return_storage_ptr__,"$",power_03,flags_00);
    }
    if (-1 < power_04) {
      return __return_storage_ptr__;
    }
  }
  unit = "rad";
LAB_003bad1e:
  addUnitPower(__return_storage_ptr__,unit,power_04,flags_00);
  return __return_storage_ptr__;
}

Assistant:

static std::string
    generateRawUnitString(const precise_unit& un, std::uint64_t flags)
{
    std::string val;
    auto bu = un.base_units();
    int cnt{0};
    cnt += addPosUnits(val, "m", bu.meter(), flags);
    cnt += addPosUnits(val, "kg", bu.kg(), flags);
    cnt += addPosUnits(val, "s", bu.second(), flags);
    cnt += addPosUnits(val, "A", bu.ampere(), flags);
    cnt += addPosUnits(val, "K", bu.kelvin(), flags);
    cnt += addPosUnits(val, "mol", bu.mole(), flags);
    cnt += addPosUnits(val, "cd", bu.candela(), flags);
    cnt += addPosUnits(val, "item", bu.count(), flags);
    cnt += addPosUnits(val, "$", bu.currency(), flags);
    cnt += addPosUnits(val, "rad", bu.radian(), flags);
    addUnitFlagStrings(un, val);
    if (cnt == 1) {
        if (bu.second() == -1 && val.empty()) {
            // deal with 1/s  which is usually Hz
            addPosUnits(val, "Hz", 1, flags);
            return val;
        }
        val.push_back('/');
        addPosUnits(val, "m", -bu.meter(), flags);
        addPosUnits(val, "kg", -bu.kg(), flags);
        addPosUnits(val, "s", -bu.second(), flags);
        addPosUnits(val, "A", -bu.ampere(), flags);
        addPosUnits(val, "K", -bu.kelvin(), flags);
        addPosUnits(val, "mol", -bu.mole(), flags);
        addPosUnits(val, "cd", -bu.candela(), flags);
        addPosUnits(val, "item", -bu.count(), flags);
        addPosUnits(val, "$", -bu.currency(), flags);
        addPosUnits(val, "rad", -bu.radian(), flags);
    } else if (cnt > 1) {
        addNegUnits(val, "m", bu.meter(), flags);
        addNegUnits(val, "kg", bu.kg(), flags);
        addNegUnits(val, "s", bu.second(), flags);
        addNegUnits(val, "A", bu.ampere(), flags);
        addNegUnits(val, "K", bu.kelvin(), flags);
        addNegUnits(val, "mol", bu.mole(), flags);
        addNegUnits(val, "cd", bu.candela(), flags);
        addNegUnits(val, "item", bu.count(), flags);
        addNegUnits(val, "$", bu.currency(), flags);
        addNegUnits(val, "rad", bu.radian(), flags);
    }
    return val;
}